

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mem.cpp
# Opt level: O1

void print_total_size(void)

{
  uint64_t uVar1;
  Mempool *pMVar2;
  Logger *pLVar3;
  
  pMVar2 = Mempool::get_instance();
  uVar1 = pMVar2->mp_total_size_kb;
  pLVar3 = Logger::get_instance();
  if ((pLVar3->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","print_total_size",0xd);
  }
  if (1 < (int)g_log_level) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"print_total_size",0xd,LOG_LEVEL_INFO,"total size of mem pool is %dkb\n",
                      (int)uVar1);
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
    return;
  }
  return;
}

Assistant:

void print_total_size()
{
    int total_size = Mempool::get_instance().get_total_size_kb();
    LOG_INFO("total size of mem pool is %dkb\n", total_size);
}